

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (CMutableTransaction *__return_storage_ptr__,TestChain100Setup *this,
          CTransactionRef input_transaction,uint32_t input_vout,int input_height,
          CKey input_signing_key,CScript output_destination,CAmount output_amount,bool submit)

{
  uchar *puVar1;
  pointer pCVar2;
  CScript scriptPubKeyIn;
  element_type *peVar3;
  undefined4 in_register_0000008c;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<CKey> __l_01;
  initializer_list<CTxOut> __l_02;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe74 [20];
  allocator_type local_169;
  vector<CKey,_std::allocator<CKey>_> local_168;
  allocator_type local_149;
  vector<COutPoint,_std::allocator<COutPoint>_> local_148;
  allocator_type local_129;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_128;
  CTxOut local_110;
  undefined1 local_e8 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_e0;
  COutPoint local_d8;
  shared_ptr<const_CTransaction> local_b0;
  direct_or_indirect local_a0;
  uint local_84;
  CTxOut local_80;
  uchar local_58 [8];
  uchar auStack_50 [8];
  uchar local_48 [8];
  uchar auStack_40 [8];
  long local_38;
  
  peVar3 = input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = *(uchar (*) [8])((long)&(pCVar2->scriptSig).super_CScriptBase + 0x11);
  auStack_50 = *(uchar (*) [8])((long)&(pCVar2->scriptSig).super_CScriptBase + 0x19);
  local_48 = *(uchar (*) [8])((long)&pCVar2->nSequence + 1);
  auStack_40 = *(uchar (*) [8])((long)&(pCVar2->scriptWitness).stack + 1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_a0.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)input_signing_key._0_8_);
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.capacity = input_vout;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe68;
  scriptPubKeyIn.super_CScriptBase._12_20_ = in_stack_fffffffffffffe74;
  CTxOut::CTxOut(&local_80,(CAmount *)&input_signing_key.keydata,scriptPubKeyIn);
  if (0x1c < local_84) {
    free(local_a0.indirect_contents.indirect);
    local_a0.indirect_contents.indirect = (char *)0x0;
  }
  local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((pointer)local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (((pointer)
                local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
               8;
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (((pointer)
                local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
               8;
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_b0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&local_128,__l,&local_129);
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = local_48[0];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = local_48[1];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = local_48[2];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = local_48[3];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = local_48[4];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = local_48[5];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = local_48[6];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = local_48[7];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = auStack_40[0];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = auStack_40[1];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = auStack_40[2];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = auStack_40[3];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = auStack_40[4];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = auStack_40[5];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = auStack_40[6];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = auStack_40[7];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = local_58[0];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = local_58[1];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = local_58[2];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = local_58[3];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = local_58[4];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = local_58[5];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = local_58[6];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = local_58[7];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = auStack_50[0];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = auStack_50[1];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = auStack_50[2];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = auStack_50[3];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = auStack_50[4];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = auStack_50[5];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = auStack_50[6];
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = auStack_50[7];
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  local_d8.n = (uint32_t)
               input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector(&local_148,__l_00,&local_149);
  CKey::CKey((CKey *)local_e8,(CKey *)CONCAT44(in_register_0000008c,input_height));
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_e8;
  std::vector<CKey,_std::allocator<CKey>_>::vector(&local_168,__l_01,&local_169);
  local_110.nValue = local_80.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_110.scriptPubKey.super_CScriptBase,&local_80.scriptPubKey.super_CScriptBase);
  __l_02._M_len = 1;
  __l_02._M_array = &local_110;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,__l_02,
             (allocator_type *)&stack0xfffffffffffffe77);
  CreateValidMempoolTransaction
            (__return_storage_ptr__,this,&local_128,&local_148,input_vout,&local_168,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,
             (bool)output_destination.super_CScriptBase._union.direct[0]);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78);
  if (0x1c < local_110.scriptPubKey.super_CScriptBase._size) {
    free(local_110.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_168);
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_e0._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_e0,
               (array<unsigned_char,_32UL> *)
               local_e0._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_128);
  if ((pointer)local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0x1c < local_80.scriptPubKey.super_CScriptBase._size) {
    free(local_80.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(CTransactionRef input_transaction,
                                                                     uint32_t input_vout,
                                                                     int input_height,
                                                                     CKey input_signing_key,
                                                                     CScript output_destination,
                                                                     CAmount output_amount,
                                                                     bool submit)
{
    COutPoint input{input_transaction->GetHash(), input_vout};
    CTxOut output{output_amount, output_destination};
    return CreateValidMempoolTransaction(/*input_transactions=*/{input_transaction},
                                         /*inputs=*/{input},
                                         /*input_height=*/input_height,
                                         /*input_signing_keys=*/{input_signing_key},
                                         /*outputs=*/{output},
                                         /*submit=*/submit);
}